

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 * rw::ps2::instanceUV(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  TexCoords *pTVar2;
  Object *pOVar3;
  uint local_40;
  uint local_3c;
  uint32 i_1;
  uint32 i;
  uint32 *d;
  uint16 j;
  uint32 n_local;
  uint32 idx_local;
  Mesh *m_local;
  Geometry *g_local;
  uint32 *p_local;
  
  pTVar2 = g->texCoords[0];
  local_3c = idx;
  g_local = (Geometry *)p;
  if (((g->flags & 4) == 0) && (local_40 = idx, (g->flags & 0x80) == 0)) {
    for (; local_40 < idx + n; local_40 = local_40 + 1) {
      pOVar3 = &g_local->object;
      (g_local->object).type = '\0';
      (g_local->object).subType = '\0';
      (g_local->object).flags = '\0';
      (g_local->object).privateFlags = '\0';
      g_local = (Geometry *)&(g_local->object).parent;
      *(undefined4 *)&pOVar3->field_0x4 = 0;
    }
  }
  else {
    for (; local_3c < idx + n; local_3c = local_3c + 1) {
      uVar1 = m->indices[local_3c];
      pOVar3 = &g_local->object;
      *(float32 *)&g_local->object = (&pTVar2->u)[(int)((uint)uVar1 << 1)];
      g_local = (Geometry *)&(g_local->object).parent;
      *(float32 *)&pOVar3->field_0x4 = (&pTVar2->u)[(int)((uint)uVar1 * 2 + 1)];
    }
  }
  for (; ((ulong)g_local & 0xf) != 0; g_local = (Geometry *)&(g_local->object).field_0x4) {
    (g_local->object).type = '\0';
    (g_local->object).subType = '\0';
    (g_local->object).flags = '\0';
    (g_local->object).privateFlags = '\0';
  }
  return (uint32 *)g_local;
}

Assistant:

uint32*
instanceUV(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->texCoords[0];
	if((g->flags & Geometry::TEXTURED) ||
	   (g->flags & Geometry::TEXTURED2))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j*2+0];
			*p++ = d[j*2+1];
		}
	else
		for(uint32 i = idx; i < idx+n; i++){
			*p++ = 0;
			*p++ = 0;
		}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}